

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O1

void __thiscall
QGraphicsItemAnimation::setTimeLine(QGraphicsItemAnimation *this,QTimeLine *timeLine)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  QTimeLine *pQVar5;
  long *plVar6;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x10);
  lVar2 = *(long *)(lVar1 + 8);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    pQVar5 = (QTimeLine *)0x0;
  }
  else {
    pQVar5 = *(QTimeLine **)(lVar1 + 0x10);
  }
  if (pQVar5 != timeLine) {
    if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x10) != 0)) {
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = *(long **)(lVar1 + 0x10);
      }
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 0x20))();
      }
    }
    if (timeLine != (QTimeLine *)0x0) {
      lVar1 = *(long *)(this + 0x10);
      uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)timeLine);
      piVar3 = *(int **)(lVar1 + 8);
      *(undefined8 *)(lVar1 + 8) = uVar4;
      *(QTimeLine **)(lVar1 + 0x10) = timeLine;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          operator_delete(piVar3);
        }
      }
      QObject::connect((QObject *)&CStack_28,(char *)timeLine,(QObject *)"2valueChanged(qreal)",
                       (char *)this,0x705786);
      QMetaObject::Connection::~Connection(&CStack_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemAnimation::setTimeLine(QTimeLine *timeLine)
{
    if (d->timeLine == timeLine)
        return;
    if (d->timeLine)
        delete d->timeLine;
    if (!timeLine)
        return;
    d->timeLine = timeLine;
    connect(timeLine, SIGNAL(valueChanged(qreal)), this, SLOT(setStep(qreal)));
}